

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Request_Size(FT_Face face,FT_Size_Request req)

{
  FT_Size pFVar1;
  FT_Size_RequestFunc UNRECOVERED_JUMPTABLE;
  FT_Error FVar2;
  FT_ULong strike_index;
  FT_Int local_10 [2];
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else {
    pFVar1 = face->size;
    if (pFVar1 == (FT_Size)0x0) {
      FVar2 = 0x24;
    }
    else {
      FVar2 = 6;
      if ((((req != (FT_Size_Request)0x0) && (-1 < req->width)) && (-1 < req->height)) &&
         (req->type < FT_SIZE_REQUEST_TYPE_MAX)) {
        (pFVar1->internal->autohint_metrics).x_scale = 0;
        UNRECOVERED_JUMPTABLE = face->driver->clazz->request_size;
        if (UNRECOVERED_JUMPTABLE != (FT_Size_RequestFunc)0x0) {
          FVar2 = (*UNRECOVERED_JUMPTABLE)(pFVar1,req);
          return FVar2;
        }
        if ((face->face_flags & 3) != 2) {
          FVar2 = FT_Request_Metrics(face,req);
          return FVar2;
        }
        FVar2 = FT_Match_Size(face,req,'\0',(FT_ULong *)local_10);
        if (FVar2 == 0) {
          FVar2 = FT_Select_Size(face,local_10[0]);
        }
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Request_Size( FT_Face          face,
                   FT_Size_Request  req )
  {
    FT_Error         error;
    FT_Driver_Class  clazz;
    FT_ULong         strike_index;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !req || req->width < 0 || req->height < 0 ||
         req->type >= FT_SIZE_REQUEST_TYPE_MAX )
      return FT_THROW( Invalid_Argument );

    /* signal the auto-hinter to recompute its size metrics */
    /* (if requested)                                       */
    face->size->internal->autohint_metrics.x_scale = 0;

    clazz = face->driver->clazz;

    if ( clazz->request_size )
    {
      error = clazz->request_size( face->size, req );

      FT_TRACE5(( "FT_Request_Size (%s driver):\n",
                  face->driver->root.clazz->module_name ));
    }
    else if ( !FT_IS_SCALABLE( face ) && FT_HAS_FIXED_SIZES( face ) )
    {
      /*
       * The reason that a driver doesn't have `request_size' defined is
       * either that the scaling here suffices or that the supported formats
       * are bitmap-only and size matching is not implemented.
       *
       * In the latter case, a simple size matching is done.
       */
      error = FT_Match_Size( face, req, 0, &strike_index );
      if ( error )
        goto Exit;

      return FT_Select_Size( face, (FT_Int)strike_index );
    }
    else
    {
      error = FT_Request_Metrics( face, req );
      if ( error )
        goto Exit;

      FT_TRACE5(( "FT_Request_Size:\n" ));
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      FT_TRACE5(( "  x scale: %ld (%f)\n",
                  metrics->x_scale, (double)metrics->x_scale / 65536 ));
      FT_TRACE5(( "  y scale: %ld (%f)\n",
                  metrics->y_scale, (double)metrics->y_scale / 65536 ));
      FT_TRACE5(( "  ascender: %f\n",
                  (double)metrics->ascender / 64 ));
      FT_TRACE5(( "  descender: %f\n",
                  (double)metrics->descender / 64 ));
      FT_TRACE5(( "  height: %f\n",
                  (double)metrics->height / 64 ));
      FT_TRACE5(( "  max advance: %f\n",
                  (double)metrics->max_advance / 64 ));
      FT_TRACE5(( "  x ppem: %d\n", metrics->x_ppem ));
      FT_TRACE5(( "  y ppem: %d\n", metrics->y_ppem ));
    }
#endif

  Exit:
    return error;
  }